

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsGetOwnPropertyDescriptor
          (JsValueRef object,JsPropertyIdRef propertyId,JsValueRef *propertyDescriptor)

{
  anon_class_24_3_7f280abc fn;
  JsErrorCode JVar1;
  JsValueRef **in_stack_ffffffffffffffc0;
  JsValueRef *local_20;
  JsValueRef *propertyDescriptor_local;
  JsPropertyIdRef propertyId_local;
  JsValueRef object_local;
  
  fn.object = &local_20;
  fn.propertyId = &propertyId_local;
  fn.propertyDescriptor = in_stack_ffffffffffffffc0;
  local_20 = propertyDescriptor;
  propertyDescriptor_local = (JsValueRef *)propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsGetOwnPropertyDescriptor::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetOwnPropertyDescriptor(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId, _Out_ JsValueRef *propertyDescriptor)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetOwnPropertyInfo, (const Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(propertyDescriptor);
        *propertyDescriptor = nullptr;

        JsErrorCode err = JsGetOwnPropertyDescriptorCommon(scriptContext, object, (const Js::PropertyRecord *)propertyId,
            propertyDescriptor);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, propertyDescriptor);

        return err;
    });
}